

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O3

void tcu::opt::registerOptions(Parser *parser)

{
  undefined1 local_210 [32];
  ParseFunc local_1f0;
  NamedValue<bool> *local_1e8;
  NamedValue<bool> *local_1e0;
  NamedValue<tcu::WindowVisibility> *pNStack_1d8;
  size_t local_1d0;
  code *local_1c8;
  SetDefaultFunc local_1c0;
  Option<tcu::opt::Validation> local_1b8;
  Option<tcu::opt::LogFlush> local_180;
  Option<tcu::opt::TestOOM> local_148;
  Option<tcu::opt::LogShaderSources> local_110;
  Option<tcu::opt::CrashHandler> local_d8;
  Option<tcu::opt::WatchDog> local_a0;
  Option<tcu::opt::StdinCaseList> local_68;
  
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = "n";
  local_210._8_8_ = "deqp-case";
  local_210._16_8_ = "Test case(s) to run, supports wildcards (e.g. dEQP-GLES2.info.*)";
  local_210._24_8_ = (char *)0x0;
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)de::cmdline::parseType<std::__cxx11::string>;
  local_1e0 = (NamedValue<bool> *)0x0;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)0x0;
  local_1d0 = 0x28;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::CasePath>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-caselist";
  local_210._16_8_ = "Case list to run in trie format (e.g. {dEQP-GLES2{info{version,renderer}}})";
  local_210._24_8_ = (char *)0x0;
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)de::cmdline::parseType<std::__cxx11::string>;
  local_1e0 = (NamedValue<bool> *)0x0;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)0x0;
  local_1d0 = 0x28;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::CaseList>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-caselist-file";
  local_210._16_8_ = "Read case list (in trie format) from given file";
  local_210._24_8_ = (char *)0x0;
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)de::cmdline::parseType<std::__cxx11::string>;
  local_1e0 = (NamedValue<bool> *)0x0;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)0x0;
  local_1d0 = 0x28;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::CaseListFile>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-caselist-resource";
  local_210._16_8_ = "Read case list (in trie format) from given file located application\'s assets"
  ;
  local_210._24_8_ = (char *)0x0;
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)de::cmdline::parseType<std::__cxx11::string>;
  local_1e0 = (NamedValue<bool> *)0x0;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)0x0;
  local_1d0 = 0x28;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::CaseListResource>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_68.shortName = (char *)0x0;
  local_68.longName = "deqp-stdin-caselist";
  local_68.description = "Read case list (in trie format) from stdin";
  local_68.defaultValue = (char *)0x0;
  local_68.parse = de::cmdline::parseType<bool>;
  local_68.namedValues = (NamedValue<bool> *)0x0;
  local_68.namedValuesEnd = (NamedValue<bool> *)0x0;
  de::cmdline::detail::Parser::addOption<tcu::opt::StdinCaseList>(parser,&local_68);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-log-filename";
  local_210._16_8_ = "Write test results to given file";
  local_210._24_8_ = "TestResults.qpa";
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)de::cmdline::parseType<std::__cxx11::string>;
  local_1e0 = (NamedValue<bool> *)0x0;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)0x0;
  local_1d0 = 0x28;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::LogFilename>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-runmode";
  local_210._16_8_ = "Execute tests, or write list of test cases into a file";
  local_210._24_8_ = "execute";
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)0x0;
  local_1e0 = (NamedValue<bool> *)registerOptions::s_runModes;
  pNStack_1d8 = registerOptions::s_visibilites;
  local_1d0 = 0x10;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::RunMode>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-caselist-export-file";
  local_210._16_8_ = "Set the target file name pattern for caselist export";
  local_210._24_8_ = "${packageName}-cases.${typeExtension}";
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)de::cmdline::parseType<std::__cxx11::string>;
  local_1e0 = (NamedValue<bool> *)0x0;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)0x0;
  local_1d0 = 0x28;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::ExportFilenamePattern>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_a0.shortName = (char *)0x0;
  local_a0.longName = "deqp-watchdog";
  local_a0.description = "Enable test watchdog";
  local_a0.defaultValue = "disable";
  local_a0.parse = (ParseFunc)0x0;
  local_a0.namedValues = registerOptions::s_enableNames;
  local_a0.namedValuesEnd = (NamedValue<bool> *)registerOptions::s_runModes;
  de::cmdline::detail::Parser::addOption<tcu::opt::WatchDog>(parser,&local_a0);
  local_d8.shortName = (char *)0x0;
  local_d8.longName = "deqp-crashhandler";
  local_d8.description = "Enable crash handling";
  local_d8.defaultValue = "disable";
  local_d8.parse = (ParseFunc)0x0;
  local_d8.namedValues = registerOptions::s_enableNames;
  local_d8.namedValuesEnd = (NamedValue<bool> *)registerOptions::s_runModes;
  de::cmdline::detail::Parser::addOption<tcu::opt::CrashHandler>(parser,&local_d8);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-base-seed";
  local_210._16_8_ = "Base seed for test cases that use randomization";
  local_210._24_8_ = "0";
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)de::cmdline::parseType<int>;
  local_1e0 = (NamedValue<bool> *)0x0;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)0x0;
  local_1d0 = 0x10;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::BaseSeed>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-test-iteration-count";
  local_210._16_8_ = "Iteration count for cases that support variable number of iterations";
  local_210._24_8_ = "0";
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)de::cmdline::parseType<int>;
  local_1e0 = (NamedValue<bool> *)0x0;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)0x0;
  local_1d0 = 0x10;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::TestIterationCount>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-visibility";
  local_210._16_8_ = "Default test window visibility";
  local_210._24_8_ = "windowed";
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)0x0;
  local_1e0 = (NamedValue<bool> *)registerOptions::s_visibilites;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)registerOptions::s_surfaceTypes;
  local_1d0 = 0x10;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::Visibility>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-surface-width";
  local_210._16_8_ = "Use given surface width if possible";
  local_210._24_8_ = "-1";
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)de::cmdline::parseType<int>;
  local_1e0 = (NamedValue<bool> *)0x0;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)0x0;
  local_1d0 = 0x10;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::SurfaceWidth>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-surface-height";
  local_210._16_8_ = "Use given surface height if possible";
  local_210._24_8_ = "-1";
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)de::cmdline::parseType<int>;
  local_1e0 = (NamedValue<bool> *)0x0;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)0x0;
  local_1d0 = 0x10;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::SurfaceHeight>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-surface-type";
  local_210._16_8_ = "Use given surface type";
  local_210._24_8_ = "window";
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)0x0;
  local_1e0 = (NamedValue<bool> *)registerOptions::s_surfaceTypes;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)registerOptions::s_screenRotations;
  local_1d0 = 0x10;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::SurfaceType>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-screen-rotation";
  local_210._16_8_ = "Screen rotation for platforms that support it";
  local_210._24_8_ = "0";
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)0x0;
  local_1e0 = (NamedValue<bool> *)registerOptions::s_screenRotations;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)&DebugOutStreambuf::vtable;
  local_1d0 = 0x10;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::ScreenRotation>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-gl-context-type";
  local_210._16_8_ = "OpenGL context type for platforms that support multiple";
  local_210._24_8_ = (char *)0x0;
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)de::cmdline::parseType<std::__cxx11::string>;
  local_1e0 = (NamedValue<bool> *)0x0;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)0x0;
  local_1d0 = 0x28;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::GLContextType>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-gl-config-id";
  local_210._16_8_ = "OpenGL (ES) render config ID (EGL config id on EGL platforms)";
  local_210._24_8_ = "-1";
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)de::cmdline::parseType<int>;
  local_1e0 = (NamedValue<bool> *)0x0;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)0x0;
  local_1d0 = 0x10;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::GLConfigID>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-gl-config-name";
  local_210._16_8_ = "Symbolic OpenGL (ES) render config name";
  local_210._24_8_ = (char *)0x0;
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)de::cmdline::parseType<std::__cxx11::string>;
  local_1e0 = (NamedValue<bool> *)0x0;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)0x0;
  local_1d0 = 0x28;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::GLConfigName>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-gl-context-flags";
  local_210._16_8_ = "OpenGL context flags (comma-separated, supports debug and robust)";
  local_210._24_8_ = (char *)0x0;
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)de::cmdline::parseType<std::__cxx11::string>;
  local_1e0 = (NamedValue<bool> *)0x0;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)0x0;
  local_1d0 = 0x28;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::GLContextFlags>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-cl-platform-id";
  local_210._16_8_ = "Execute tests on given OpenCL platform (IDs start from 1)";
  local_210._24_8_ = "1";
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)de::cmdline::parseType<int>;
  local_1e0 = (NamedValue<bool> *)0x0;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)0x0;
  local_1d0 = 0x10;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::CLPlatformID>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-cl-device-ids";
  local_210._16_8_ = "Execute tests on given CL devices (comma-separated, IDs start from 1)";
  local_210._24_8_ = "";
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)parseIntList;
  local_1e0 = (NamedValue<bool> *)0x0;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)0x0;
  local_1d0 = 0x20;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::CLDeviceIDs>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-cl-build-options";
  local_210._16_8_ = "Extra build options for OpenCL compiler";
  local_210._24_8_ = (char *)0x0;
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)de::cmdline::parseType<std::__cxx11::string>;
  local_1e0 = (NamedValue<bool> *)0x0;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)0x0;
  local_1d0 = 0x28;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::CLBuildOptions>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-egl-display-type";
  local_210._16_8_ = "EGL native display type";
  local_210._24_8_ = (char *)0x0;
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)de::cmdline::parseType<std::__cxx11::string>;
  local_1e0 = (NamedValue<bool> *)0x0;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)0x0;
  local_1d0 = 0x28;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::EGLDisplayType>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-egl-window-type";
  local_210._16_8_ = "EGL native window type";
  local_210._24_8_ = (char *)0x0;
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)de::cmdline::parseType<std::__cxx11::string>;
  local_1e0 = (NamedValue<bool> *)0x0;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)0x0;
  local_1d0 = 0x28;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::EGLWindowType>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-egl-pixmap-type";
  local_210._16_8_ = "EGL native pixmap type";
  local_210._24_8_ = (char *)0x0;
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)de::cmdline::parseType<std::__cxx11::string>;
  local_1e0 = (NamedValue<bool> *)0x0;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)0x0;
  local_1d0 = 0x28;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::EGLPixmapType>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_1c0 = (SetDefaultFunc)0x0;
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-vk-device-id";
  local_210._16_8_ = "Vulkan device ID (IDs start from 1)";
  local_210._24_8_ = "1";
  local_1f0 = (ParseFunc)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1e8 = (NamedValue<bool> *)de::cmdline::parseType<int>;
  local_1e0 = (NamedValue<bool> *)0x0;
  pNStack_1d8 = (NamedValue<tcu::WindowVisibility> *)0x0;
  local_1d0 = 0x10;
  local_1c8 = de::cmdline::detail::Parser::dispatchParse<tcu::opt::VKDeviceID>;
  de::cmdline::detail::Parser::addOption(parser,(OptInfo *)local_210);
  local_210._0_8_ = (char *)0x0;
  local_210._8_8_ = "deqp-log-images";
  local_210._16_8_ = "Enable or disable logging of result images";
  local_210._24_8_ = "enable";
  local_1f0 = (ParseFunc)0x0;
  local_1e8 = registerOptions::s_enableNames;
  local_1e0 = (NamedValue<bool> *)registerOptions::s_runModes;
  de::cmdline::detail::Parser::addOption<tcu::opt::LogImages>
            (parser,(Option<tcu::opt::LogImages> *)local_210);
  local_110.shortName = (char *)0x0;
  local_110.longName = "deqp-log-shader-sources";
  local_110.description = "Enable or disable logging of shader sources";
  local_110.defaultValue = "enable";
  local_110.parse = (ParseFunc)0x0;
  local_110.namedValues = registerOptions::s_enableNames;
  local_110.namedValuesEnd = (NamedValue<bool> *)registerOptions::s_runModes;
  de::cmdline::detail::Parser::addOption<tcu::opt::LogShaderSources>(parser,&local_110);
  local_148.shortName = (char *)0x0;
  local_148.longName = "deqp-test-oom";
  local_148.description = "Run tests that exhaust memory on purpose";
  local_148.defaultValue = "disable";
  local_148.parse = (ParseFunc)0x0;
  local_148.namedValues = registerOptions::s_enableNames;
  local_148.namedValuesEnd = (NamedValue<bool> *)registerOptions::s_runModes;
  de::cmdline::detail::Parser::addOption<tcu::opt::TestOOM>(parser,&local_148);
  local_180.shortName = (char *)0x0;
  local_180.longName = "deqp-log-flush";
  local_180.description = "Enable or disable log file fflush";
  local_180.defaultValue = "enable";
  local_180.parse = (ParseFunc)0x0;
  local_180.namedValues = registerOptions::s_enableNames;
  local_180.namedValuesEnd = (NamedValue<bool> *)registerOptions::s_runModes;
  de::cmdline::detail::Parser::addOption<tcu::opt::LogFlush>(parser,&local_180);
  local_1b8.shortName = (char *)0x0;
  local_1b8.longName = "deqp-validation";
  local_1b8.description = "Enable or disable test case validation";
  local_1b8.defaultValue = "disable";
  local_1b8.parse = (ParseFunc)0x0;
  local_1b8.namedValues = registerOptions::s_enableNames;
  local_1b8.namedValuesEnd = (NamedValue<bool> *)registerOptions::s_runModes;
  de::cmdline::detail::Parser::addOption<tcu::opt::Validation>(parser,&local_1b8);
  return;
}

Assistant:

void registerOptions (de::cmdline::Parser& parser)
{
	using de::cmdline::Option;
	using de::cmdline::NamedValue;

	static const NamedValue<bool> s_enableNames[] =
	{
		{ "enable",		true	},
		{ "disable",	false	}
	};
	static const NamedValue<tcu::RunMode> s_runModes[] =
	{
		{ "execute",		RUNMODE_EXECUTE				},
		{ "xml-caselist",	RUNMODE_DUMP_XML_CASELIST	},
		{ "txt-caselist",	RUNMODE_DUMP_TEXT_CASELIST	},
		{ "stdout-caselist",RUNMODE_DUMP_STDOUT_CASELIST}
	};
	static const NamedValue<WindowVisibility> s_visibilites[] =
	{
		{ "windowed",		WINDOWVISIBILITY_WINDOWED	},
		{ "fullscreen",		WINDOWVISIBILITY_FULLSCREEN	},
		{ "hidden",			WINDOWVISIBILITY_HIDDEN		}
	};
	static const NamedValue<tcu::SurfaceType> s_surfaceTypes[] =
	{
		{ "window",			SURFACETYPE_WINDOW				},
		{ "pixmap",			SURFACETYPE_OFFSCREEN_NATIVE	},
		{ "pbuffer",		SURFACETYPE_OFFSCREEN_GENERIC	},
		{ "fbo",			SURFACETYPE_FBO					}
	};
	static const NamedValue<tcu::ScreenRotation> s_screenRotations[] =
	{
		{ "unspecified",	SCREENROTATION_UNSPECIFIED	},
		{ "0",				SCREENROTATION_0			},
		{ "90",				SCREENROTATION_90			},
		{ "180",			SCREENROTATION_180			},
		{ "270",			SCREENROTATION_270			}
	};

	parser
		<< Option<CasePath>				("n",		"deqp-case",					"Test case(s) to run, supports wildcards (e.g. dEQP-GLES2.info.*)")
		<< Option<CaseList>				(DE_NULL,	"deqp-caselist",				"Case list to run in trie format (e.g. {dEQP-GLES2{info{version,renderer}}})")
		<< Option<CaseListFile>			(DE_NULL,	"deqp-caselist-file",			"Read case list (in trie format) from given file")
		<< Option<CaseListResource>		(DE_NULL,	"deqp-caselist-resource",		"Read case list (in trie format) from given file located application's assets")
		<< Option<StdinCaseList>		(DE_NULL,	"deqp-stdin-caselist",			"Read case list (in trie format) from stdin")
		<< Option<LogFilename>			(DE_NULL,	"deqp-log-filename",			"Write test results to given file",					"TestResults.qpa")
		<< Option<RunMode>				(DE_NULL,	"deqp-runmode",					"Execute tests, or write list of test cases into a file",
																																		s_runModes,			"execute")
		<< Option<ExportFilenamePattern>(DE_NULL,	"deqp-caselist-export-file",	"Set the target file name pattern for caselist export",					"${packageName}-cases.${typeExtension}")
		<< Option<WatchDog>				(DE_NULL,	"deqp-watchdog",				"Enable test watchdog",								s_enableNames,		"disable")
		<< Option<CrashHandler>			(DE_NULL,	"deqp-crashhandler",			"Enable crash handling",							s_enableNames,		"disable")
		<< Option<BaseSeed>				(DE_NULL,	"deqp-base-seed",				"Base seed for test cases that use randomization",						"0")
		<< Option<TestIterationCount>	(DE_NULL,	"deqp-test-iteration-count",	"Iteration count for cases that support variable number of iterations",	"0")
		<< Option<Visibility>			(DE_NULL,	"deqp-visibility",				"Default test window visibility",					s_visibilites,		"windowed")
		<< Option<SurfaceWidth>			(DE_NULL,	"deqp-surface-width",			"Use given surface width if possible",									"-1")
		<< Option<SurfaceHeight>		(DE_NULL,	"deqp-surface-height",			"Use given surface height if possible",									"-1")
		<< Option<SurfaceType>			(DE_NULL,	"deqp-surface-type",			"Use given surface type",							s_surfaceTypes,		"window")
		<< Option<ScreenRotation>		(DE_NULL,	"deqp-screen-rotation",			"Screen rotation for platforms that support it",	s_screenRotations,	"0")
		<< Option<GLContextType>		(DE_NULL,	"deqp-gl-context-type",			"OpenGL context type for platforms that support multiple")
		<< Option<GLConfigID>			(DE_NULL,	"deqp-gl-config-id",			"OpenGL (ES) render config ID (EGL config id on EGL platforms)",		"-1")
		<< Option<GLConfigName>			(DE_NULL,	"deqp-gl-config-name",			"Symbolic OpenGL (ES) render config name")
		<< Option<GLContextFlags>		(DE_NULL,	"deqp-gl-context-flags",		"OpenGL context flags (comma-separated, supports debug and robust)")
		<< Option<CLPlatformID>			(DE_NULL,	"deqp-cl-platform-id",			"Execute tests on given OpenCL platform (IDs start from 1)",			"1")
		<< Option<CLDeviceIDs>			(DE_NULL,	"deqp-cl-device-ids",			"Execute tests on given CL devices (comma-separated, IDs start from 1)",	parseIntList,	"")
		<< Option<CLBuildOptions>		(DE_NULL,	"deqp-cl-build-options",		"Extra build options for OpenCL compiler")
		<< Option<EGLDisplayType>		(DE_NULL,	"deqp-egl-display-type",		"EGL native display type")
		<< Option<EGLWindowType>		(DE_NULL,	"deqp-egl-window-type",			"EGL native window type")
		<< Option<EGLPixmapType>		(DE_NULL,	"deqp-egl-pixmap-type",			"EGL native pixmap type")
		<< Option<VKDeviceID>			(DE_NULL,	"deqp-vk-device-id",			"Vulkan device ID (IDs start from 1)",									"1")
		<< Option<LogImages>			(DE_NULL,	"deqp-log-images",				"Enable or disable logging of result images",		s_enableNames,		"enable")
		<< Option<LogShaderSources>		(DE_NULL,	"deqp-log-shader-sources",		"Enable or disable logging of shader sources",		s_enableNames,		"enable")
		<< Option<TestOOM>				(DE_NULL,	"deqp-test-oom",				"Run tests that exhaust memory on purpose",			s_enableNames,		TEST_OOM_DEFAULT)
		<< Option<LogFlush>				(DE_NULL,	"deqp-log-flush",				"Enable or disable log file fflush",				s_enableNames,		"enable")
		<< Option<Validation>			(DE_NULL,	"deqp-validation",				"Enable or disable test case validation",			s_enableNames,		"disable");
}